

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O3

int target_add_call_res_op
              (c2m_ctx_t c2m_ctx,type *ret_type,target_arg_info_t *arg_info,
              size_t call_arg_area_offset)

{
  undefined8 *puVar1;
  MIR_error_func_t p_Var2;
  VARR_MIR_op_t *pVVar3;
  MIR_context_t pMVar4;
  c2mir_options *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int64_t iVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  uint uVar14;
  MIR_type_t MVar15;
  MIR_reg_t reg;
  int iVar16;
  MIR_type_t MVar17;
  MIR_op_t *__ptr;
  MIR_insn_t_conflict insn;
  void *pvVar18;
  MIR_error_func_t extraout_RAX;
  MIR_type_t MVar19;
  gen_ctx *disp;
  ulong uVar20;
  decl_t pdVar21;
  void *pvVar22;
  decl_t pdVar23;
  size_t sVar24;
  gen_ctx_conflict *pgVar25;
  c2m_ctx_t ctx;
  c2m_ctx_t c2m_ctx_00;
  ulong uVar26;
  MIR_type_t qword_types [2];
  MIR_type_t aMStack_1f0 [2];
  gen_ctx_conflict *pgStack_1e8;
  MIR_error_func_t p_Stack_1e0;
  undefined8 local_138;
  uint32_t uStack_130;
  MIR_reg_t MStack_12c;
  MIR_alias_t MStack_128;
  long lStack_124;
  MIR_type_t local_100 [2];
  MIR_context_t local_f8;
  c2mir_options *pcStack_f0;
  MIR_context_t pMStack_e8;
  c2mir_options *pcStack_e0;
  undefined1 local_d8 [168];
  
  ctx = (c2m_ctx_t)c2m_ctx->ctx;
  pgVar25 = c2m_ctx->gen_ctx;
  if ((ret_type->mode != TM_BASIC) || (uVar14 = 0xffffffff, (ret_type->u).basic_type != TP_VOID)) {
    p_Stack_1e0 = (MIR_error_func_t)0x1a90aa;
    uVar14 = process_ret_type(c2m_ctx,ret_type,local_100);
    if (uVar14 == 0) {
      if ((ret_type->mode & ~TM_BASIC) == TM_STRUCT) {
        arg_info->n_iregs = arg_info->n_iregs + 1;
        p_Stack_1e0 = (MIR_error_func_t)0x1a9224;
        get_new_temp((op_t *)local_d8,c2m_ctx,MIR_T_I64);
        uVar10 = local_d8._32_4_;
        pMStack_e8 = (MIR_context_t)CONCAT44(local_d8._20_4_,local_d8._16_4_);
        pcStack_e0 = (c2mir_options *)CONCAT44(local_d8._28_4_,local_d8._24_4_);
        local_f8 = (MIR_context_t)local_d8._0_8_;
        pcStack_f0 = (c2mir_options *)local_d8._8_8_;
        p_Stack_1e0 = (MIR_error_func_t)0x1a9276;
        reg = MIR_reg((MIR_context_t)ctx,"fp",(pgVar25->curr_func->u).func);
        p_Stack_1e0 = (MIR_error_func_t)0x1a9288;
        MIR_new_reg_op((MIR_context_t)ctx,reg);
        p_Stack_1e0 = (MIR_error_func_t)0x1a92ae;
        MIR_new_int_op((MIR_context_t)ctx,call_arg_area_offset);
        local_d8._0_8_ = pMStack_e8;
        local_d8._8_8_ = pcStack_e0;
        local_d8._16_4_ = local_d8._32_4_;
        local_d8._20_4_ = local_d8._36_4_;
        local_d8._24_4_ = local_d8._40_4_;
        local_d8._28_4_ = local_d8._44_4_;
        local_d8._32_4_ = local_d8._48_4_;
        local_d8._36_4_ = local_d8._52_4_;
        local_d8._40_4_ = (undefined4)local_d8._56_8_;
        local_d8._44_4_ = SUB84(local_d8._56_8_,4);
        p_Stack_1e0 = (MIR_error_func_t)0x1a9347;
        insn = MIR_new_insn(c2m_ctx->ctx,MIR_ADD);
        p_Stack_1e0 = (MIR_error_func_t)0x1a9352;
        emit_insn_opt(c2m_ctx,insn);
        p_Stack_1e0 = (MIR_error_func_t)0x1a935d;
        disp = (gen_ctx *)raw_type_size(c2m_ctx,ret_type);
        uVar26 = (ulong)ret_type->align;
        if (uVar26 != 0) {
          uVar20 = (long)disp->call_used_hard_regs + (uVar26 - 0x69);
          disp = (gen_ctx *)(uVar20 - uVar20 % uVar26);
        }
        c2m_ctx_00 = (c2m_ctx_t)local_d8;
        p_Stack_1e0 = (MIR_error_func_t)0x1a93a8;
        MIR_new_mem_op((MIR_op_t *)c2m_ctx_00,(MIR_context_t)ctx,MIR_T_RBLK,(MIR_disp_t)disp,uVar10,
                       0,'\x01');
        uVar10 = local_d8._16_4_;
        local_138 = CONCAT44(local_d8._24_4_,local_d8._20_4_);
        lStack_124 = CONCAT44(local_d8._44_4_,local_d8._40_4_);
        uStack_130 = local_d8._28_4_;
        pMStack_e8 = (MIR_context_t)local_d8._0_8_;
        pcStack_e0 = (c2mir_options *)local_d8._8_8_;
        MStack_12c = local_d8._32_4_;
        MStack_128 = local_d8._36_4_;
        pgVar25 = (gen_ctx_conflict *)pgVar25->call_ops;
        pvVar18 = (pgVar25->zero_op).mir_op.data;
        if (pvVar18 == (void *)0x0) {
LAB_001a956d:
          p_Stack_1e0 = (MIR_error_func_t)0x1a9572;
          target_add_call_res_op_cold_3();
          c2m_ctx = ctx;
LAB_001a9572:
          p_Stack_1e0 = VARR_MIR_op_tlast;
          target_add_call_res_op_cold_2();
          p_Stack_1e0 = extraout_RAX;
          if (((c2m_ctx != (c2m_ctx_t)0x0) &&
              (p_Stack_1e0 = (MIR_error_func_t)c2m_ctx->env[0].__jmpbuf[0],
              p_Stack_1e0 != (MIR_error_func_t)0x0)) &&
             (disp = (gen_ctx *)c2m_ctx->ctx, disp != (gen_ctx *)0x0)) {
            p_Var2 = p_Stack_1e0 + (long)disp * 0x30 + -0x30;
            pMVar4 = *(MIR_context_t *)p_Var2;
            pcVar5 = *(c2mir_options **)(p_Var2 + 8);
            pvVar18 = *(void **)(p_Var2 + 0x10);
            uVar6 = *(undefined8 *)(p_Var2 + 0x18);
            p_Var2 = p_Stack_1e0 + (long)disp * 0x30 + -0x20;
            uVar7 = *(undefined8 *)(p_Var2 + 8);
            iVar8 = *(int64_t *)(p_Var2 + 0x10);
            uVar9 = *(undefined8 *)(p_Var2 + 0x18);
            c2m_ctx_00->env[0].__jmpbuf[0] = (long)*(void **)p_Var2;
            c2m_ctx_00->env[0].__jmpbuf[1] = uVar7;
            ((anon_union_32_12_57d33f68_for_u *)(c2m_ctx_00->env[0].__jmpbuf + 2))->i = iVar8;
            c2m_ctx_00->env[0].__jmpbuf[3] = uVar9;
            c2m_ctx_00->ctx = pMVar4;
            c2m_ctx_00->options = pcVar5;
            c2m_ctx_00->env[0].__jmpbuf[0] = (long)pvVar18;
            c2m_ctx_00->env[0].__jmpbuf[1] = uVar6;
            return (int)p_Stack_1e0;
          }
          iVar16 = (int)disp;
          pgStack_1e8 = (gen_ctx_conflict *)target_get_blk_type;
          VARR_MIR_op_tlast_cold_1();
          pgStack_1e8 = pgVar25;
          iVar16 = classify_arg(c2m_ctx_00,(type *)c2m_ctx,aMStack_1f0,iVar16);
          if ((*(uint *)(c2m_ctx->env[0].__jmpbuf + 1) & 0xfffffffe) != 4) {
            __assert_fail("arg_type->mode == TM_STRUCT || arg_type->mode == TM_UNION",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                          ,0x166,"MIR_type_t target_get_blk_type(c2m_ctx_t, struct type *)");
          }
          MVar17 = get_blk_type(iVar16,aMStack_1f0);
          return MVar17;
        }
        pdVar23 = (pgVar25->zero_op).decl;
        pdVar21 = (decl_t)&pdVar23->field_0x1;
        if (*(undefined1 **)&(pgVar25->zero_op).field_0x8 < pdVar21) {
          p_Stack_1e0 = (MIR_error_func_t)0x1a9419;
          pvVar18 = realloc(pvVar18,(long)((long)pdVar21 + ((ulong)pdVar21 >> 1)) * 0x30);
          (pgVar25->zero_op).mir_op.data = pvVar18;
          *(undefined1 **)&(pgVar25->zero_op).field_0x8 =
               (undefined1 *)((long)pdVar21 + ((ulong)pdVar21 >> 1));
          pdVar23 = (pgVar25->zero_op).decl;
          pdVar21 = (decl_t)&pdVar23->field_0x1;
        }
        (pgVar25->zero_op).decl = pdVar21;
        pvVar22 = (void *)((long)pvVar18 + (long)pdVar23 * 0x30);
        puVar1 = (undefined8 *)((long)pvVar18 + (long)pdVar23 * 0x30);
        *puVar1 = pMStack_e8;
        puVar1[1] = pcStack_e0;
        uVar14 = 0;
        local_d8._32_4_ = uVar10;
      }
      else {
        p_Stack_1e0 = (MIR_error_func_t)0x1a945e;
        MVar15 = get_mir_type(c2m_ctx,ret_type);
        MVar19 = MVar15 & 0x1d;
        disp = (gen_ctx *)(ulong)MVar19;
        c2m_ctx_00 = (c2m_ctx_t)local_d8;
        MVar17 = MIR_T_U32;
        if (MVar19 != MIR_T_U8) {
          MVar17 = MVar15;
        }
        MVar15 = MIR_T_I32;
        if (MVar19 != MIR_T_I8) {
          MVar15 = MVar17;
        }
        p_Stack_1e0 = (MIR_error_func_t)0x1a948b;
        get_new_temp((op_t *)c2m_ctx_00,c2m_ctx,MVar15);
        pMStack_e8 = (MIR_context_t)CONCAT44(local_d8._20_4_,local_d8._16_4_);
        pcStack_e0 = (c2mir_options *)CONCAT44(local_d8._28_4_,local_d8._24_4_);
        local_138 = CONCAT44(local_d8._40_4_,local_d8._36_4_);
        uStack_130 = local_d8._44_4_;
        local_f8 = (MIR_context_t)local_d8._0_8_;
        pcStack_f0 = (c2mir_options *)local_d8._8_8_;
        MStack_12c = local_d8._48_4_;
        MStack_128 = local_d8._52_4_;
        lStack_124 = local_d8._56_8_;
        pgVar25 = (gen_ctx_conflict *)pgVar25->call_ops;
        pvVar18 = (pgVar25->zero_op).mir_op.data;
        if (pvVar18 == (void *)0x0) goto LAB_001a9572;
        pdVar23 = (pgVar25->zero_op).decl;
        pdVar21 = (decl_t)&pdVar23->field_0x1;
        if (*(undefined1 **)&(pgVar25->zero_op).field_0x8 < pdVar21) {
          p_Stack_1e0 = (MIR_error_func_t)0x1a9503;
          pvVar18 = realloc(pvVar18,(long)((long)pdVar21 + ((ulong)pdVar21 >> 1)) * 0x30);
          (pgVar25->zero_op).mir_op.data = pvVar18;
          *(undefined1 **)&(pgVar25->zero_op).field_0x8 =
               (undefined1 *)((long)pdVar21 + ((ulong)pdVar21 >> 1));
          pdVar23 = (pgVar25->zero_op).decl;
          pdVar21 = (decl_t)&pdVar23->field_0x1;
        }
        (pgVar25->zero_op).decl = pdVar21;
        pvVar22 = (void *)((long)pvVar18 + (long)pdVar23 * 0x30);
        puVar1 = (undefined8 *)((long)pvVar18 + (long)pdVar23 * 0x30);
        *puVar1 = pMStack_e8;
        puVar1[1] = pcStack_e0;
        uVar14 = 1;
      }
      *(undefined4 *)((long)pvVar22 + 0x10) = local_d8._32_4_;
      *(undefined8 *)((long)pvVar22 + 0x14) = local_138;
      *(ulong *)((long)pvVar22 + 0x1c) = CONCAT44(MStack_12c,uStack_130);
      *(ulong *)((long)pvVar22 + 0x20) = CONCAT44(MStack_128,MStack_12c);
      *(long *)((long)pvVar22 + 0x28) = lStack_124;
    }
    else if (0 < (int)uVar14) {
      uVar26 = 0;
      do {
        c2m_ctx_00 = (c2m_ctx_t)local_d8;
        MVar15 = local_100[uVar26] & ~MIR_T_I16;
        MVar17 = local_100[uVar26];
        if (MVar15 == MIR_T_U8) {
          MVar17 = MIR_T_U32;
        }
        disp = (gen_ctx *)0x4;
        if (MVar15 == MIR_T_I8) {
          MVar17 = MIR_T_I32;
        }
        p_Stack_1e0 = (MIR_error_func_t)0x1a910e;
        ctx = c2m_ctx;
        get_new_temp((op_t *)c2m_ctx_00,c2m_ctx,MVar17);
        uVar7 = local_d8._56_8_;
        uVar13 = local_d8._52_4_;
        uVar12 = local_d8._48_4_;
        uVar11 = local_d8._44_4_;
        uVar10 = local_d8._32_4_;
        pMStack_e8 = (MIR_context_t)CONCAT44(local_d8._20_4_,local_d8._16_4_);
        pcStack_e0 = (c2mir_options *)CONCAT44(local_d8._28_4_,local_d8._24_4_);
        uVar6 = CONCAT44(local_d8._40_4_,local_d8._36_4_);
        local_f8 = (MIR_context_t)local_d8._0_8_;
        pcStack_f0 = (c2mir_options *)local_d8._8_8_;
        pVVar3 = pgVar25->call_ops;
        __ptr = pVVar3->varr;
        if (__ptr == (MIR_op_t *)0x0) {
          p_Stack_1e0 = (MIR_error_func_t)0x1a956d;
          target_add_call_res_op_cold_1();
          goto LAB_001a956d;
        }
        sVar24 = pVVar3->els_num;
        uVar20 = sVar24 + 1;
        if (pVVar3->size < uVar20) {
          sVar24 = (uVar20 >> 1) + uVar20;
          p_Stack_1e0 = (MIR_error_func_t)0x1a9185;
          __ptr = (MIR_op_t *)realloc(__ptr,sVar24 * 0x30);
          pVVar3->varr = __ptr;
          pVVar3->size = sVar24;
          sVar24 = pVVar3->els_num;
          uVar20 = sVar24 + 1;
        }
        pVVar3->els_num = uVar20;
        uVar26 = uVar26 + 1;
        __ptr[sVar24].data = pMStack_e8;
        *(c2mir_options **)&__ptr[sVar24].field_0x8 = pcStack_e0;
        __ptr[sVar24].u.reg = uVar10;
        puVar1 = (undefined8 *)((long)&__ptr[sVar24].u.str.len + 4);
        *puVar1 = uVar6;
        puVar1[1] = CONCAT44(uVar12,uVar11);
        puVar1 = (undefined8 *)((long)&__ptr[sVar24].u + 0x10);
        *puVar1 = CONCAT44(uVar13,uVar12);
        puVar1[1] = uVar7;
      } while (uVar14 != uVar26);
    }
  }
  return uVar14;
}

Assistant:

static int target_add_call_res_op (c2m_ctx_t c2m_ctx, struct type *ret_type,
                                   target_arg_info_t *arg_info, size_t call_arg_area_offset) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t type;
  MIR_type_t qword_types[MAX_QWORDS];
  op_t temp;
  int i, n_qwords;

  if (void_type_p (ret_type)) return -1;
  n_qwords = process_ret_type (c2m_ctx, ret_type, qword_types);
  if (n_qwords != 0) {
    for (i = 0; i < n_qwords; i++) {
      temp = get_new_temp (c2m_ctx, promote_mir_int_type (qword_types[i]));
      VARR_PUSH (MIR_op_t, call_ops, temp.mir_op);
    }
    return n_qwords;
  } else if (ret_type->mode == TM_STRUCT || ret_type->mode == TM_UNION) { /* return by reference */
    arg_info->n_iregs++;
    temp = get_new_temp (c2m_ctx, MIR_T_I64);
    emit3 (c2m_ctx, MIR_ADD, temp.mir_op,
           MIR_new_reg_op (ctx, MIR_reg (ctx, FP_NAME, curr_func->u.func)),
           MIR_new_int_op (ctx, call_arg_area_offset));
    temp.mir_op
      = MIR_new_mem_op (ctx, MIR_T_RBLK, type_size (c2m_ctx, ret_type), temp.mir_op.u.reg, 0, 1);
    VARR_PUSH (MIR_op_t, call_ops, temp.mir_op);
    return 0;
  } else {
    type = get_mir_type (c2m_ctx, ret_type);
    type = promote_mir_int_type (type);
    temp = get_new_temp (c2m_ctx, type);
    VARR_PUSH (MIR_op_t, call_ops, temp.mir_op);
    return 1;
  }
}